

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpListener.cpp
# Opt level: O0

int __thiscall
TcpListener::accept(TcpListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  socket_t __fd_00;
  TcpConn *tc;
  socket_t sock;
  socklen_t l;
  sockaddr_in addr;
  TcpListener *this_local;
  
  addr.sin_zero = (uchar  [8])this;
  memset(&sock,0,0x10);
  tc._4_4_ = 0x10;
  __fd_00 = Socket::GetFd(&(this->m_socket).super_Socket);
  tc._0_4_ = ::accept(__fd_00,(sockaddr *)&sock,(socklen_t *)((long)&tc + 4));
  if ((int)tc < 0) {
    this_local = (TcpListener *)0x0;
  }
  else {
    this_local = (TcpListener *)operator_new(0x50);
    TcpConn::TcpConn((TcpConn *)this_local,(int)tc);
    (*(((TcpConn *)this_local)->super_PollObj)._vptr_PollObj[6])();
  }
  return (int)this_local;
}

Assistant:

TcpConn *TcpListener::accept()
{
    struct sockaddr_in addr = {0};
    socklen_t l = sizeof(addr);
    socket_t sock = ::accept(m_socket.GetFd(), (struct sockaddr *)&addr, &l);
    if (sock < 0)
    {
        return nullptr;
    }
    TcpConn *tc = new TcpConn(sock);
    tc->Init();
    //ts->makeKeepAlive(30, 5, 3);
    return tc;
}